

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enctest.cpp
# Opt level: O2

void __thiscall ConstantAccel::Print(ConstantAccel *this,ostream *out)

{
  ostream *poVar1;
  
  std::operator<<(out,"ConstantAccel: a = ");
  poVar1 = std::ostream::_M_insert<double>((this->super_MotionBase).accel);
  std::operator<<(poVar1,", pf = ");
  poVar1 = std::ostream::_M_insert<double>((this->super_MotionBase).pf);
  std::operator<<(poVar1,", vf = ");
  poVar1 = std::ostream::_M_insert<double>((this->super_MotionBase).vf);
  std::operator<<(poVar1,", tf = ");
  poVar1 = std::ostream::_M_insert<double>((this->super_MotionBase).tf);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void Print(std::ostream &out) const
    { out << "ConstantAccel: a = " << accel << ", pf = " << pf << ", vf = " << vf << ", tf = " << tf << std::endl; }